

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_visitor.cpp
# Opt level: O0

void __thiscall delete_visitor::visit(delete_visitor *this,ExtendedClassDeclaration *ptr)

{
  Declarations *pDVar1;
  string *psVar2;
  ExtendedClassDeclaration *ptr_local;
  delete_visitor *this_local;
  
  pDVar1 = (ptr->super_Class_declaration).declarations;
  (**(pDVar1->super_Base)._vptr_Base)(pDVar1,this);
  psVar2 = (ptr->super_Class_declaration).name;
  if (psVar2 != (string *)0x0) {
    std::__cxx11::string::~string((string *)psVar2);
    operator_delete(psVar2,0x20);
  }
  psVar2 = ptr->base;
  if (psVar2 != (string *)0x0) {
    std::__cxx11::string::~string((string *)psVar2);
    operator_delete(psVar2,0x20);
  }
  if (ptr != (ExtendedClassDeclaration *)0x0) {
    (*(ptr->super_Class_declaration).super_Base._vptr_Base[2])();
  }
  return;
}

Assistant:

void delete_visitor::visit(ExtendedClassDeclaration* ptr) {

    ptr->declarations->accept(this);
    
    //name, base
    delete ptr->name;
    delete ptr->base;
    delete ptr;
}